

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::scroll(QWidget *this,int dx,int dy)

{
  long lVar1;
  bool bVar2;
  QObjectList *this_00;
  qsizetype qVar3;
  QGraphicsProxyWidget *pQVar4;
  QRect *this_01;
  QRect *pQVar5;
  int in_EDX;
  int in_ESI;
  QRectF *in_RDI;
  long in_FS_OFFSET;
  QRect *rect;
  const_iterator __end2;
  const_iterator __begin2;
  QRegion *__range2;
  QGraphicsProxyWidget *proxy;
  QWidgetPrivate *d;
  QWidget *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  QWidgetPrivate *in_stack_ffffffffffffff48;
  QWidgetPrivate *in_stack_ffffffffffffff50;
  QRectF *in_stack_ffffffffffffff58;
  QRectF *rect_00;
  qreal in_stack_ffffffffffffffa8;
  qreal in_stack_ffffffffffffffb0;
  QGraphicsItem *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  rect_00 = in_RDI;
  bVar2 = updatesEnabled((QWidget *)0x37f298);
  if (!bVar2) {
    this_00 = QObject::children((QObject *)0x37f2a6);
    qVar3 = QList<QObject_*>::size(this_00);
    if (qVar3 == 0) goto LAB_0037f447;
  }
  bVar2 = isVisible((QWidget *)0x37f2be);
  if ((bVar2) && ((in_ESI != 0 || (in_EDX != 0)))) {
    d_func((QWidget *)0x37f2e4);
    pQVar4 = QWidgetPrivate::nearestGraphicsProxyWidget(in_stack_ffffffffffffff38);
    if (pQVar4 == (QGraphicsProxyWidget *)0x0) {
      QWidgetPrivate::setDirtyOpaqueRegion(in_stack_ffffffffffffff50);
      QWidgetPrivate::scroll_sys
                (in_stack_ffffffffffffff48,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                 (int)in_stack_ffffffffffffff40);
    }
    else {
      this_01 = (QRect *)QRegion::begin();
      pQVar5 = (QRect *)QRegion::end();
      for (; this_01 != pQVar5; this_01 = this_01 + 1) {
        in_stack_ffffffffffffff58 =
             (QRectF *)&(pQVar4->super_QGraphicsWidget).super_QGraphicsObject.super_QGraphicsItem;
        QRect::translated(this_01,(int)((ulong)pQVar5 >> 0x20),(int)pQVar5);
        QRectF::QRectF((QRectF *)in_stack_ffffffffffffff50,(QRect *)in_stack_ffffffffffffff48);
        QGraphicsItem::update((QGraphicsItem *)in_RDI,in_stack_ffffffffffffff58);
      }
      QGraphicsProxyWidget::subWidgetRect
                ((QGraphicsProxyWidget *)in_stack_ffffffffffffff58,
                 (QWidget *)CONCAT44(in_ESI,in_EDX));
      QGraphicsItem::scroll
                (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                 rect_00);
    }
  }
LAB_0037f447:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::scroll(int dx, int dy)
{
    if ((!updatesEnabled() && children().size() == 0) || !isVisible())
        return;
    if (dx == 0 && dy == 0)
        return;
    Q_D(QWidget);
#if QT_CONFIG(graphicsview)
    if (QGraphicsProxyWidget *proxy = QWidgetPrivate::nearestGraphicsProxyWidget(this)) {
        // Graphics View maintains its own dirty region as a list of rects;
        // until we can connect item updates directly to the view, we must
        // separately add a translated dirty region.
        for (const QRect &rect : d->dirty)
            proxy->update(rect.translated(dx, dy));
        proxy->scroll(dx, dy, proxy->subWidgetRect(this));
        return;
    }
#endif
    d->setDirtyOpaqueRegion();
    d->scroll_sys(dx, dy);
}